

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDescriptor.cpp
# Opt level: O3

void generateDescriptor(Mat *in,vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keyPoint,
                       vector<Descriptor,_std::allocator<Descriptor>_> *keyPointDescriptor)

{
  int in_R8D;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> keyPointRotation;
  Mat grayImg;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> local_b8;
  Mat local_98 [96];
  _InputArray local_38;
  
  cv::Mat::Mat(local_98);
  local_b8.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_b8.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x1010000);
  local_38.sz.width = 0;
  local_38.sz.height = 0;
  local_38.flags = 0x2010000;
  local_b8.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in;
  local_38.obj = local_98;
  cv::cvtColor((cv *)&local_b8,&local_38,(_OutputArray *)0x6,0,in_R8D);
  local_b8.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  kPRotation(local_98,keyPoint,&local_b8);
  extractDescriptor(local_98,&local_b8,keyPointDescriptor);
  if (local_b8.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  cv::Mat::~Mat(local_98);
  return;
}

Assistant:

void generateDescriptor(const Mat& in, const vector<KeyPoint> keyPoint, vector<Descriptor>& keyPointDescriptor) {
	Mat grayImg;
	cvtColor(in, grayImg, COLOR_BGR2GRAY);

	vector<KeyPoint> keyPointRotation;
	kPRotation(grayImg, keyPoint, keyPointRotation);

	//Mat out;
	//drawKeypoints(in, keyPointRotation, out, -1, DrawMatchesFlags::DRAW_RICH_KEYPOINTS);
	//imshow("", out);
	//waitKey();

	extractDescriptor(grayImg, keyPointRotation, keyPointDescriptor);

}